

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireEmptyHandTest::
expectTryingAddCardAndClearIt<solitaire::piles::FoundationPileMock>
          (SolitaireEmptyHandTest *this,FoundationPileMock *pile,
          optional<solitaire::cards::Card> *card)

{
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> *this_00;
  TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)> *this_01;
  type local_8a;
  type local_89;
  Action<void_(std::optional<solitaire::cards::Card>_&)> local_88;
  WithoutMatchers local_65 [13];
  Matcher<std::optional<solitaire::cards::Card>_&> local_58;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> local_40;
  optional<solitaire::cards::Card> *local_20;
  optional<solitaire::cards::Card> *card_local;
  FoundationPileMock *pile_local;
  SolitaireEmptyHandTest *this_local;
  
  local_20 = card;
  card_local = (optional<solitaire::cards::Card> *)pile;
  pile_local = (FoundationPileMock *)this;
  testing::Matcher<std::optional<solitaire::cards::Card>_&>::Matcher(&local_58,card);
  piles::FoundationPileMock::gmock_tryAddCard(&local_40,pile,&local_58);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::operator()
                      (&local_40,local_65,(void *)0x0);
  this_01 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                               ,200,"pile","tryAddCard(card)");
  testing::
  Invoke<solitaire::SolitaireEmptyHandTest::expectTryingAddCardAndClearIt<solitaire::piles::FoundationPileMock>(solitaire::piles::FoundationPileMock&,std::optional<solitaire::cards::Card>&)::_lambda(auto:1&)_1_>
            (&local_8a);
  testing::Action<void(std::optional<solitaire::cards::Card>&)>::
  Action<solitaire::SolitaireEmptyHandTest::expectTryingAddCardAndClearIt<solitaire::piles::FoundationPileMock>(solitaire::piles::FoundationPileMock&,std::optional<solitaire::cards::Card>&)::_lambda(auto:1&)_1_,void>
            ((Action<void(std::optional<solitaire::cards::Card>&)> *)&local_88,&local_89);
  testing::internal::TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)>::WillOnce
            (this_01,&local_88);
  testing::Action<void_(std::optional<solitaire::cards::Card>_&)>::~Action(&local_88);
  testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::~MockSpec(&local_40);
  testing::Matcher<std::optional<solitaire::cards::Card>_&>::~Matcher(&local_58);
  return;
}

Assistant:

void expectTryingAddCardAndClearIt(Pile& pile, std::optional<Card>& card) {
        EXPECT_CALL(pile, tryAddCard(card))
            .WillOnce(Invoke([](auto& card) {card = std::nullopt;}));
    }